

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void resolveAlias(Parse *pParse,ExprList *pEList,int iCol,Expr *pExpr,int nSubquery)

{
  sqlite3 *db;
  Expr *pExpr_00;
  long in_FS_OFFSET;
  Walker local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pExpr->pAggInfo == (AggInfo *)0x0) {
    db = pParse->db;
    pExpr_00 = sqlite3ExprDup(db,pEList->a[iCol].pExpr,0);
    if (db->mallocFailed != '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        sqlite3ExprDelete(db,pExpr_00);
        return;
      }
      goto LAB_0017ae30;
    }
    if (0 < nSubquery) {
      local_88.pParse = (Parse *)0x0;
      local_88.walkerDepth = 0;
      local_88.eCode = 0;
      local_88.mWFlags = 0;
      local_88.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
      local_88.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_88.xExprCallback = incrAggDepth;
      local_88.u._4_4_ = 0;
      local_88.u.n = nSubquery;
      sqlite3WalkExpr(&local_88,pExpr_00);
    }
    if (pExpr->op == 'r') {
      pExpr_00 = sqlite3ExprAddCollateString(pParse,pExpr_00,(pExpr->u).zToken);
    }
    memcpy(&local_88,pExpr_00,0x48);
    memcpy(pExpr_00,pExpr,0x48);
    memcpy(pExpr,&local_88,0x48);
    if (((pExpr->flags & 0x1000000) != 0) && ((pExpr->y).pWin != (Window *)0x0)) {
      ((pExpr->y).pWin)->pOwner = pExpr;
    }
    sqlite3ExprDeferredDelete(pParse,pExpr_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0017ae30:
  __stack_chk_fail();
}

Assistant:

static void resolveAlias(
  Parse *pParse,         /* Parsing context */
  ExprList *pEList,      /* A result set */
  int iCol,              /* A column in the result set.  0..pEList->nExpr-1 */
  Expr *pExpr,           /* Transform this into an alias to the result set */
  int nSubquery          /* Number of subqueries that the label is moving */
){
  Expr *pOrig;           /* The iCol-th column of the result set */
  Expr *pDup;            /* Copy of pOrig */
  sqlite3 *db;           /* The database connection */

  assert( iCol>=0 && iCol<pEList->nExpr );
  pOrig = pEList->a[iCol].pExpr;
  assert( pOrig!=0 );
  assert( !ExprHasProperty(pExpr, EP_Reduced|EP_TokenOnly) );
  if( pExpr->pAggInfo ) return;
  db = pParse->db;
  pDup = sqlite3ExprDup(db, pOrig, 0);
  if( db->mallocFailed ){
    sqlite3ExprDelete(db, pDup);
    pDup = 0;
  }else{
    Expr temp;
    incrAggFunctionDepth(pDup, nSubquery);
    if( pExpr->op==TK_COLLATE ){
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      pDup = sqlite3ExprAddCollateString(pParse, pDup, pExpr->u.zToken);
    }
    memcpy(&temp, pDup, sizeof(Expr));
    memcpy(pDup, pExpr, sizeof(Expr));
    memcpy(pExpr, &temp, sizeof(Expr));
    if( ExprHasProperty(pExpr, EP_WinFunc) ){
      if( ALWAYS(pExpr->y.pWin!=0) ){
        pExpr->y.pWin->pOwner = pExpr;
      }
    }
    sqlite3ExprDeferredDelete(pParse, pDup);
  }
}